

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  uint uVar1;
  OPJ_BYTE *pOVar2;
  OPJ_OFF_T OVar3;
  OPJ_SIZE_T OVar4;
  char *fmt;
  uint uVar5;
  ulong new_size;
  int iVar6;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1072,
                  "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1073,
                  "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1074,
                  "OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  uVar5 = (p_j2k->m_specific_param).m_decoder.m_end_tile_x;
  if (uVar5 < 0x2aaa) {
    (p_j2k->m_specific_param).m_encoder.m_Ttlmi_is_byte = (uint)(uVar5 < 0x100);
    iVar6 = (6 - (uint)(uVar5 < 0x100)) * uVar5;
    uVar1 = iVar6 + 6;
    new_size = (ulong)uVar1;
    pOVar2 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar1) {
      pOVar2 = (OPJ_BYTE *)opj_realloc(pOVar2,new_size);
      if (pOVar2 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = 0;
        fmt = "Not enough memory to write TLM marker\n";
        goto LAB_001203bf;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar2;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar1;
    }
    memset(pOVar2,0,new_size);
    pOVar2 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    OVar3 = opj_stream_tell(p_stream);
    (p_j2k->m_specific_param).m_encoder.m_tlm_start = OVar3;
    opj_write_bytes_LE(pOVar2,0xff55,2);
    opj_write_bytes_LE(pOVar2 + 2,iVar6 + 4,2);
    opj_write_bytes_LE(pOVar2 + 4,0,1);
    opj_write_bytes_LE(pOVar2 + 5,(uint)(0xff < uVar5) * 0x10 + 0x50,1);
    OVar4 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,new_size,
                       p_manager);
    uVar5 = (uint)(OVar4 == new_size);
  }
  else {
    fmt = "A maximum of 10921 tile-parts are supported currently when writing TLM marker\n";
LAB_001203bf:
    uVar5 = 0;
    opj_event_msg(p_manager,1,fmt);
  }
  return uVar5;
}

Assistant:

static OPJ_BOOL opj_j2k_write_tlm(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tlm_size;
    OPJ_UINT32 size_per_tile_part;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    /* 10921 = (65535 - header_size) / size_per_tile_part where */
    /* header_size = 4 and size_per_tile_part = 6 */
    if (p_j2k->m_specific_param.m_encoder.m_total_tile_parts > 10921) {
        /* We could do more but it would require writing several TLM markers */
        opj_event_msg(p_manager, EVT_ERROR,
                      "A maximum of 10921 tile-parts are supported currently "
                      "when writing TLM marker\n");
        return OPJ_FALSE;
    }

    if (p_j2k->m_specific_param.m_encoder.m_total_tile_parts <= 255) {
        size_per_tile_part = 5;
        p_j2k->m_specific_param.m_encoder.m_Ttlmi_is_byte = OPJ_TRUE;
    } else {
        size_per_tile_part = 6;
        p_j2k->m_specific_param.m_encoder.m_Ttlmi_is_byte = OPJ_FALSE;
    }

    l_tlm_size = 2 + 4 + (size_per_tile_part *
                          p_j2k->m_specific_param.m_encoder.m_total_tile_parts);

    if (l_tlm_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_tlm_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write TLM marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_tlm_size;
    }
    memset(p_j2k->m_specific_param.m_encoder.m_header_tile_data, 0, l_tlm_size);

    l_current_data = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    /* change the way data is written to avoid seeking if possible */
    /* TODO */
    p_j2k->m_specific_param.m_encoder.m_tlm_start = opj_stream_tell(p_stream);

    opj_write_bytes(l_current_data, J2K_MS_TLM,
                    2);                                   /* TLM */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tlm_size - 2,
                    2);                                 /* Lpoc */
    l_current_data += 2;

    opj_write_bytes(l_current_data, 0,
                    1);                                                    /* Ztlm=0*/
    ++l_current_data;

    /* Stlm 0x50= ST=1(8bits-255 tiles max),SP=1(Ptlm=32bits) */
    /* Stlm 0x60= ST=2(16bits-65535 tiles max),SP=1(Ptlm=32bits) */
    opj_write_bytes(l_current_data,
                    size_per_tile_part == 5 ? 0x50 : 0x60,
                    1);
    ++l_current_data;

    /* do nothing on the size_per_tile_part * l_j2k->m_specific_param.m_encoder.m_total_tile_parts remaining data */
    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_tlm_size,
                              p_manager) != l_tlm_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}